

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

CaseFold * re2::LookupCaseFold(CaseFold *f,int n,Rune r)

{
  CaseFold *pCVar1;
  int iVar2;
  bool bVar3;
  CaseFold *pCVar4;
  CaseFold *pCVar5;
  uint uVar6;
  
  pCVar1 = f + n;
  pCVar4 = (CaseFold *)((long)n * 3);
  do {
    if (n < 1) {
      pCVar4 = (CaseFold *)0x0;
      if (f < pCVar1) {
        pCVar4 = f;
      }
      return pCVar4;
    }
    uVar6 = (uint)n >> 1;
    iVar2 = f[uVar6].lo;
    if ((r < iVar2) || (pCVar5 = f + uVar6, pCVar5->hi < r)) {
      n = n - (uVar6 + 1);
      if (r < iVar2) {
        n = uVar6;
      }
      uVar6 = uVar6 + 1;
      if (r < iVar2) {
        uVar6 = 0;
      }
      f = f + uVar6;
      bVar3 = true;
      pCVar5 = pCVar4;
    }
    else {
      bVar3 = false;
    }
    pCVar4 = pCVar5;
  } while (bVar3);
  return pCVar5;
}

Assistant:

const CaseFold* LookupCaseFold(const CaseFold *f, int n, Rune r) {
  const CaseFold* ef = f + n;

  // Binary search for entry containing r.
  while (n > 0) {
    int m = n/2;
    if (f[m].lo <= r && r <= f[m].hi)
      return &f[m];
    if (r < f[m].lo) {
      n = m;
    } else {
      f += m+1;
      n -= m+1;
    }
  }

  // There is no entry that contains r, but f points
  // where it would have been.  Unless f points at
  // the end of the array, it points at the next entry
  // after r.
  if (f < ef)
    return f;

  // No entry contains r; no entry contains runes > r.
  return NULL;
}